

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.cpp
# Opt level: O3

utf8proc_ssize_t
duckdb::utf8proc_decompose_char
          (utf8proc_int32_t uc,utf8proc_int32_t *dst,utf8proc_ssize_t bufsize,
          utf8proc_option_t options,int *last_boundclass)

{
  long lVar1;
  ushort uVar2;
  bool bVar3;
  utf8proc_bool uVar4;
  utf8proc_uint16_t seqindex;
  utf8proc_ssize_t uVar5;
  short sVar6;
  uint uVar7;
  utf8proc_option_t uVar8;
  ulong uVar9;
  uint uVar10;
  utf8proc_option_t options_00;
  bool bVar11;
  bool bVar12;
  
  uVar5 = -4;
  if ((uint)uc < 0x110000) {
    uVar7 = uc - 0xac00;
    bVar11 = (options & (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) != 0;
    if (bVar11 && uVar7 < 0x2ba4) {
      sVar6 = (short)uVar7;
      if (0 < bufsize) {
        uVar10 = (uVar7 & 0xffff) / 0x24c;
        *dst = uVar10 + 0x1100;
        if (bufsize == 1) {
          return 3 - (ulong)((ushort)((ushort)(sVar6 * 0x6db7) >> 2 | sVar6 * -0x4000) < 0x925);
        }
        dst[1] = (uVar7 + uVar10 * -0x24c & 0xffff) / 0x1c + 0x1161;
      }
      uVar7 = (uVar7 & 0xffff) >> 2;
      sVar6 = sVar6 - ((short)(uVar7 / 7) * 0x1b + (short)(uVar7 / 7));
      if (sVar6 == 0) {
        uVar5 = 2;
      }
      else {
        uVar5 = 3;
        if (2 < bufsize) {
          dst[2] = (uint)(ushort)(sVar6 + 0x11a7);
        }
      }
    }
    else {
      uVar8 = options & ~UTF8PROC_LUMP;
      uVar7 = (uint)(ushort)(&utf8proc_stage1table)[(uint)uc >> 8] + (uc & 0xffU);
      bVar12 = (options & (UTF8PROC_DECOMPOSE|UTF8PROC_COMPOSE)) != 0;
LAB_01cbeafa:
      do {
        do {
          do {
            bVar3 = bVar11;
            uVar10 = uc;
            options_00 = options;
            uVar9 = (ulong)*(ushort *)(&utf8proc_stage2table + (ulong)uVar7 * 2);
            uVar2 = (&utf8proc_properties)[uVar9 * 0xc];
            if (((options_00 & UTF8PROC_REJECTNA) != 0) && (uVar2 == 0)) {
              return -4;
            }
            lVar1 = uVar9 * 0x18;
            if ((((options_00 & UTF8PROC_IGNORE) != 0) &&
                ((*(byte *)(&DAT_01f03894 + uVar9 * 0xc) & 4) != 0)) ||
               (((options_00 >> 0xe & 1) != 0 && (uVar2 == 0)))) goto LAB_01cbee12;
            if ((options_00 >> 0xc & 1) == 0) goto LAB_01cbedfd;
            uVar7 = 0x20;
            options = uVar8;
            uc = 0x20;
            bVar11 = bVar12;
          } while (uVar2 == 0x17);
          uVar7 = 0x27;
          uc = 0x27;
        } while ((((uVar10 & 0x1ffffe) == 0x2018) || (uc = 0x27, uVar10 == 700)) ||
                (uc = 0x27, uVar10 == 0x2c8));
        uVar7 = 0x2d;
        uc = 0x2d;
      } while ((uVar10 == 0x2212) || (uc = 0x2d, uVar2 == 0xd));
      if ((int)uVar10 < 0x2236) {
        if ((int)uVar10 < 0x2044) {
          if (uVar10 == 0x2039) goto LAB_01cbecbd;
          if (uVar10 == 0x203a) goto LAB_01cbec96;
        }
        else {
          uVar7 = 0x2f;
          uc = 0x2f;
          if ((uVar10 == 0x2044) || (uc = 0x2f, uVar10 == 0x2215)) goto LAB_01cbeafa;
          if (uVar10 == 0x2216) {
            uVar7 = 0x5c;
            uc = 0x5c;
            goto LAB_01cbeafa;
          }
        }
      }
      else {
        if (0x2329 < (int)uVar10) {
          if (uVar10 != 0x232a) {
            if (uVar10 == 0x3008) goto LAB_01cbecbd;
            if (uVar10 != 0x3009) goto LAB_01cbece7;
          }
LAB_01cbec96:
          uVar7 = 0x3e;
          uc = 0x3e;
          goto LAB_01cbeafa;
        }
        if (uVar10 == 0x2236) {
          uVar7 = 0x3a;
          uc = 0x3a;
          goto LAB_01cbeafa;
        }
        if (uVar10 == 0x2329) {
LAB_01cbecbd:
          uVar7 = 0x3c;
          uc = 0x3c;
          goto LAB_01cbeafa;
        }
      }
LAB_01cbece7:
      uVar7 = 0x5e;
      uc = 0x5e;
      if ((((uVar10 & 0x1ffffd) == 0x2c4) || (uc = 0x5e, uVar10 == 0x2038)) ||
         (uc = 0x5e, uVar10 == 0x2303)) goto LAB_01cbeafa;
      uVar7 = 0x5f;
      uc = 0x5f;
      if ((uVar10 == 0x2cd) || (uc = 0x5f, uVar2 == 0xc)) goto LAB_01cbeafa;
      uVar7 = 0x60;
      uc = 0x60;
      if (uVar10 == 0x2cb) goto LAB_01cbeafa;
      if (uVar10 == 0x223c) {
        uVar7 = 0x7e;
        uc = 0x7e;
        goto LAB_01cbeafa;
      }
      if (uVar10 == 0x2223) {
        uVar7 = 0x7c;
        uc = 0x7c;
        goto LAB_01cbeafa;
      }
      if ((~options_00 & 0x180) != 0) goto LAB_01cbedfd;
      uVar7 = 10;
      uc = 10;
      if ((uVar2 & 0xfffe) == 0x18) goto LAB_01cbeafa;
LAB_01cbedfd:
      if (((options_00 >> 0xd & 1) == 0) || (2 < (ushort)(uVar2 - 6))) {
        if ((((options_00 >> 10 & 1) != 0) &&
            (seqindex = *(utf8proc_uint16_t *)(&UNK_01f0388a + lVar1), seqindex != 0xffff)) ||
           (((bVar3 && (seqindex = *(utf8proc_uint16_t *)(&UNK_01f03888 + lVar1), seqindex != 0xffff
                       )) &&
            (((options_00 & UTF8PROC_COMPAT) != 0 || (*(short *)(&UNK_01f03886 + lVar1) == 0)))))) {
          uVar5 = seqindex_write_char_decomposed(seqindex,dst,bufsize,options_00,last_boundclass);
          return uVar5;
        }
        if (((options_00 >> 0xb & 1) == 0) ||
           (uVar4 = grapheme_break_extended
                              (0,(ushort)(&DAT_01f03894)[uVar9 * 0xc] >> 8 & 0x3f,0,
                               (uint)((ushort)(&DAT_01f03894)[uVar9 * 0xc] >> 0xe),last_boundclass),
           !uVar4)) {
          uVar5 = 1;
          if (0 < bufsize) {
            *dst = uVar10;
          }
        }
        else {
          uVar5 = 2;
          if ((0 < bufsize) && (*dst = -1, bufsize != 1)) {
            dst[1] = uVar10;
          }
        }
      }
      else {
LAB_01cbee12:
        uVar5 = 0;
      }
    }
  }
  return uVar5;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_decompose_char(utf8proc_int32_t uc, utf8proc_int32_t *dst, utf8proc_ssize_t bufsize, utf8proc_option_t options, int *last_boundclass) {
  const utf8proc_property_t *property;
  utf8proc_propval_t category;
  utf8proc_int32_t hangul_sindex;
  if (uc < 0 || uc >= 0x110000) return UTF8PROC_ERROR_NOTASSIGNED;
  property = unsafe_get_property(uc);
  category = property->category;
  hangul_sindex = uc - UTF8PROC_HANGUL_SBASE;
  if (options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) {
    if (hangul_sindex >= 0 && hangul_sindex < UTF8PROC_HANGUL_SCOUNT) {
      utf8proc_int32_t hangul_tindex;
      if (bufsize >= 1) {
        dst[0] = UTF8PROC_HANGUL_LBASE +
          hangul_sindex / UTF8PROC_HANGUL_NCOUNT;
        if (bufsize >= 2) dst[1] = UTF8PROC_HANGUL_VBASE +
          (hangul_sindex % UTF8PROC_HANGUL_NCOUNT) / UTF8PROC_HANGUL_TCOUNT;
      }
      hangul_tindex = hangul_sindex % UTF8PROC_HANGUL_TCOUNT;
      if (!hangul_tindex) return 2;
      if (bufsize >= 3) dst[2] = UTF8PROC_HANGUL_TBASE + hangul_tindex;
      return 3;
    }
  }
  if (options & UTF8PROC_REJECTNA) {
    if (!category) return UTF8PROC_ERROR_NOTASSIGNED;
  }
  if (options & UTF8PROC_IGNORE) {
    if (property->ignorable) return 0;
  }
  if (options & UTF8PROC_STRIPNA) {
    if (!category) return 0;
  }
  if (options & UTF8PROC_LUMP) {
    if (category == UTF8PROC_CATEGORY_ZS) utf8proc_decompose_lump(0x0020);
    if (uc == 0x2018 || uc == 0x2019 || uc == 0x02BC || uc == 0x02C8)
      utf8proc_decompose_lump(0x0027);
    if (category == UTF8PROC_CATEGORY_PD || uc == 0x2212)
      utf8proc_decompose_lump(0x002D);
    if (uc == 0x2044 || uc == 0x2215) utf8proc_decompose_lump(0x002F);
    if (uc == 0x2236) utf8proc_decompose_lump(0x003A);
    if (uc == 0x2039 || uc == 0x2329 || uc == 0x3008)
      utf8proc_decompose_lump(0x003C);
    if (uc == 0x203A || uc == 0x232A || uc == 0x3009)
      utf8proc_decompose_lump(0x003E);
    if (uc == 0x2216) utf8proc_decompose_lump(0x005C);
    if (uc == 0x02C4 || uc == 0x02C6 || uc == 0x2038 || uc == 0x2303)
      utf8proc_decompose_lump(0x005E);
    if (category == UTF8PROC_CATEGORY_PC || uc == 0x02CD)
      utf8proc_decompose_lump(0x005F);
    if (uc == 0x02CB) utf8proc_decompose_lump(0x0060);
    if (uc == 0x2223) utf8proc_decompose_lump(0x007C);
    if (uc == 0x223C) utf8proc_decompose_lump(0x007E);
    if ((options & UTF8PROC_NLF2LS) && (options & UTF8PROC_NLF2PS)) {
      if (category == UTF8PROC_CATEGORY_ZL ||
          category == UTF8PROC_CATEGORY_ZP)
        utf8proc_decompose_lump(0x000A);
    }
  }
  if (options & UTF8PROC_STRIPMARK) {
    if (category == UTF8PROC_CATEGORY_MN ||
      category == UTF8PROC_CATEGORY_MC ||
      category == UTF8PROC_CATEGORY_ME) return 0;
  }
  if (options & UTF8PROC_CASEFOLD) {
    if (property->casefold_seqindex != UINT16_MAX) {
      return seqindex_write_char_decomposed(property->casefold_seqindex, dst, bufsize, options, last_boundclass);
    }
  }
  if (options & (UTF8PROC_COMPOSE|UTF8PROC_DECOMPOSE)) {
    if (property->decomp_seqindex != UINT16_MAX &&
        (!property->decomp_type || (options & UTF8PROC_COMPAT))) {
      return seqindex_write_char_decomposed(property->decomp_seqindex, dst, bufsize, options, last_boundclass);
        }
  }
  if (options & UTF8PROC_CHARBOUND) {
    utf8proc_bool boundary;
    boundary = grapheme_break_extended(0, property->boundclass, 0, property->indic_conjunct_break,
                                       last_boundclass);
    if (boundary) {
      if (bufsize >= 1) dst[0] = -1; /* sentinel value for grapheme break */
      if (bufsize >= 2) dst[1] = uc;
      return 2;
    }
  }
  if (bufsize >= 1) *dst = uc;
  return 1;
}